

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

size_t duckdb_snappy::Compress(Source *reader,Sink *writer,CompressionOptions options)

{
  uint16_t *table;
  uint32_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t input_size;
  size_t sVar7;
  size_t sVar8;
  int in_stack_ffffffffffffff68;
  size_t fragment_size;
  size_t local_88;
  ulong local_80;
  int local_74;
  ulong local_70;
  Sink *local_68;
  char ulength [5];
  WorkingMemory wmem;
  
  local_74 = options.level;
  uVar1 = (*reader->_vptr_Source[2])();
  input_size = CONCAT44(extraout_var,uVar1);
  pcVar3 = Varint::Encode32(ulength,uVar1);
  sVar7 = (long)pcVar3 - (long)ulength;
  local_68 = writer;
  (*writer->_vptr_Sink[2])(writer,ulength,sVar7);
  internal::WorkingMemory::WorkingMemory(&wmem,input_size);
  while (input_size != 0) {
    iVar2 = (*reader->_vptr_Source[3])(reader);
    pcVar3 = wmem.input_;
    sVar8 = fragment_size;
    pcVar4 = (char *)CONCAT44(extraout_var_00,iVar2);
    uVar5 = 0x10000;
    if (input_size < 0x10000) {
      uVar5 = input_size;
    }
    local_88 = sVar7;
    local_80 = input_size;
    uVar6 = uVar5;
    if (fragment_size < uVar5) {
      switchD_00917c1c::default(wmem.input_,pcVar4,fragment_size);
      (*reader->_vptr_Source[4])(reader);
      for (; uVar6 = uVar5 - sVar8, sVar8 <= uVar5 && uVar6 != 0; sVar8 = sVar8 + sVar7) {
        iVar2 = (*reader->_vptr_Source[3])(reader,&fragment_size);
        sVar7 = fragment_size;
        if (uVar6 < fragment_size) {
          sVar7 = uVar6;
        }
        switchD_00917c1c::default(pcVar3 + sVar8,(void *)CONCAT44(extraout_var_01,iVar2),sVar7);
        (*reader->_vptr_Source[4])(reader);
      }
      local_70 = 0;
      pcVar4 = pcVar3;
      uVar6 = local_70;
    }
    local_70 = uVar6;
    fragment_size = uVar5;
    uVar1 = anon_unknown_3::CalculateTableSize((uint32_t)uVar5);
    switchD_004a0b15::default(wmem.table_,0,(ulong)uVar1 * 2);
    table = wmem.table_;
    iVar2 = (*local_68->_vptr_Sink[3])(local_68,uVar5 + uVar5 / 6 + 0x20,wmem.output_);
    pcVar3 = (char *)CONCAT44(extraout_var_02,iVar2);
    if (local_74 == 2) {
      pcVar4 = internal::CompressFragmentDoubleHash
                         (pcVar4,fragment_size,pcVar3,table,(int)uVar1 >> 1,
                          table + ((int)uVar1 >> 1),in_stack_ffffffffffffff68);
    }
    else if (local_74 == 1) {
      pcVar4 = internal::CompressFragment(pcVar4,fragment_size,pcVar3,table,uVar1);
    }
    else {
      pcVar4 = (char *)0x0;
    }
    uVar6 = local_80;
    sVar7 = local_88;
    (*local_68->_vptr_Sink[2])(local_68,pcVar3,(long)pcVar4 - (long)pcVar3);
    (*reader->_vptr_Source[4])(reader,local_70);
    sVar7 = sVar7 + ((long)pcVar4 - (long)pcVar3);
    input_size = uVar6 - uVar5;
  }
  internal::WorkingMemory::~WorkingMemory(&wmem);
  return sVar7;
}

Assistant:

size_t Compress(Source* reader, Sink* writer, CompressionOptions options) {
  assert(options.level == 1 || options.level == 2);
  int token = 0;
  size_t written = 0;
  size_t N = reader->Available();
  const size_t uncompressed_size = N;
  char ulength[Varint::kMax32];
  char* p = Varint::Encode32(ulength, N);
  writer->Append(ulength, p - ulength);
  written += (p - ulength);

  internal::WorkingMemory wmem(N);

  while (N > 0) {
    // Get next block to compress (without copying if possible)
    size_t fragment_size;
    const char* fragment = reader->Peek(&fragment_size);
    assert(fragment_size != 0);  // premature end of input
    const size_t num_to_read = std::min(N, kBlockSize);
    size_t bytes_read = fragment_size;

    size_t pending_advance = 0;
    if (bytes_read >= num_to_read) {
      // Buffer returned by reader is large enough
      pending_advance = num_to_read;
      fragment_size = num_to_read;
    } else {
      char* scratch = wmem.GetScratchInput();
      std::memcpy(scratch, fragment, bytes_read);
      reader->Skip(bytes_read);

      while (bytes_read < num_to_read) {
        fragment = reader->Peek(&fragment_size);
        size_t n = std::min<size_t>(fragment_size, num_to_read - bytes_read);
        std::memcpy(scratch + bytes_read, fragment, n);
        bytes_read += n;
        reader->Skip(n);
      }
      assert(bytes_read == num_to_read);
      fragment = scratch;
      fragment_size = num_to_read;
    }
    assert(fragment_size == num_to_read);

    // Get encoding table for compression
    int table_size;
    uint16_t* table = wmem.GetHashTable(num_to_read, &table_size);

    // Compress input_fragment and append to dest
    int max_output = MaxCompressedLength(num_to_read);

    // Since we encode kBlockSize regions followed by a region
    // which is <= kBlockSize in length, a previously allocated
    // scratch_output[] region is big enough for this iteration.
    // Need a scratch buffer for the output, in case the byte sink doesn't
    // have room for us directly.
    char* dest = writer->GetAppendBuffer(max_output, wmem.GetScratchOutput());
    char* end = nullptr;
    if (options.level == 1) {
      end = internal::CompressFragment(fragment, fragment_size, dest, table,
                                       table_size);
    } else if (options.level == 2) {
      end = internal::CompressFragmentDoubleHash(
          fragment, fragment_size, dest, table, table_size >> 1,
          table + (table_size >> 1), table_size >> 1);
    }
    writer->Append(dest, end - dest);
    written += (end - dest);

    N -= num_to_read;
    reader->Skip(pending_advance);
  }

  Report(token, "snappy_compress", written, uncompressed_size);
  return written;
}